

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O1

bool __thiscall
FadBinaryMul<FadExpr<FadBinaryPow<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>_>_>_>
::hasFastAccess(FadBinaryMul<FadExpr<FadBinaryPow<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>_>_>_>
                *this)

{
  bool bVar1;
  
  if (((((this->left_->fadexpr_).left_)->dx_).num_elts != 0) &&
     ((((this->left_->fadexpr_).right_)->dx_).num_elts != 0)) {
    bVar1 = FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>_>
            ::hasFastAccess(&this->right_->fadexpr_);
    return bVar1;
  }
  return false;
}

Assistant:

bool hasFastAccess() const { return left_.hasFastAccess() && right_.hasFastAccess();}